

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O3

void __thiscall Assimp::ASE::Parser::ParseLV2MeshBlock(Parser *this,Mesh *mesh)

{
  byte bVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  byte *pbVar5;
  byte *pbVar6;
  int iVar7;
  uint iIndex;
  uint iNumCFaces;
  uint iNumCVertices;
  uint iNumTFaces;
  uint iNumTVertices;
  uint iNumFaces;
  uint iNumVertices;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  iVar7 = 0;
  local_34 = 0;
  local_38 = 0;
  local_3c = 0;
  local_40 = 0;
  local_44 = 0;
  local_48 = 0;
LAB_00402a11:
  do {
    while( true ) {
      pbVar6 = (byte *)this->filePtr;
      bVar1 = *pbVar6;
      if (bVar1 == 0x2a) break;
LAB_00402f73:
      bVar3 = false;
      if (bVar1 < 0x7b) {
        if ((bVar1 - 0xc < 2) || (bVar1 == 10)) {
          if (this->bLastWasEndLine != false) goto LAB_00402fb1;
          this->iLineNumber = this->iLineNumber + 1;
          bVar3 = true;
        }
        else {
          bVar3 = false;
          if (bVar1 == 0) {
            LogError(this,"Encountered unexpected EOL while parsing a *MESH chunk (Level 2)");
          }
        }
      }
      else {
        if (bVar1 == 0x7d) {
          iVar7 = iVar7 + -1;
          if (iVar7 == 0) {
            this->filePtr = (char *)(pbVar6 + 1);
            SkipToNextToken(this);
            return;
          }
        }
        else {
          if (bVar1 != 0x7b) goto LAB_00402fb3;
          iVar7 = iVar7 + 1;
        }
LAB_00402fb1:
        bVar3 = false;
      }
LAB_00402fb3:
      this->bLastWasEndLine = bVar3;
      this->filePtr = (char *)(pbVar6 + 1);
    }
    pbVar5 = pbVar6 + 1;
    this->filePtr = (char *)pbVar5;
    iVar4 = strncmp("MESH_NUMVERTEX",(char *)pbVar5,0xe);
    if (iVar4 != 0) {
LAB_00402a3e:
      iVar4 = strncmp("MESH_NUMTVERTEX",(char *)pbVar5,0xf);
      if (iVar4 == 0) {
        bVar1 = pbVar6[0x10];
        if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
          pbVar5 = pbVar6 + 0x11;
          if (bVar1 == 0) {
            pbVar5 = pbVar6 + 0x10;
          }
          this->filePtr = (char *)pbVar5;
          ParseLV4MeshLong(this,&local_3c);
          goto LAB_00402a11;
        }
      }
      iVar4 = strncmp("MESH_NUMCVERTEX",(char *)pbVar5,0xf);
      if (iVar4 == 0) {
        bVar1 = pbVar6[0x10];
        if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
          pbVar5 = pbVar6 + 0x11;
          if (bVar1 == 0) {
            pbVar5 = pbVar6 + 0x10;
          }
          this->filePtr = (char *)pbVar5;
          ParseLV4MeshLong(this,&local_44);
          goto LAB_00402a11;
        }
      }
      iVar4 = strncmp("MESH_NUMFACES",(char *)pbVar5,0xd);
      if (iVar4 == 0) {
        bVar1 = pbVar6[0xe];
        if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
          pbVar5 = pbVar6 + 0xf;
          if (bVar1 == 0) {
            pbVar5 = pbVar6 + 0xe;
          }
          this->filePtr = (char *)pbVar5;
          ParseLV4MeshLong(this,&local_38);
          goto LAB_00402a11;
        }
      }
      iVar4 = strncmp("MESH_NUMTVFACES",(char *)pbVar5,0xf);
      if (iVar4 == 0) {
        bVar1 = pbVar6[0x10];
        if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
          pbVar5 = pbVar6 + 0x11;
          if (bVar1 == 0) {
            pbVar5 = pbVar6 + 0x10;
          }
          this->filePtr = (char *)pbVar5;
          ParseLV4MeshLong(this,&local_40);
          goto LAB_00402a11;
        }
      }
      iVar4 = strncmp("MESH_NUMCVFACES",(char *)pbVar5,0xf);
      if (iVar4 == 0) {
        bVar1 = pbVar6[0x10];
        if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
          pbVar5 = pbVar6 + 0x11;
          if (bVar1 == 0) {
            pbVar5 = pbVar6 + 0x10;
          }
          this->filePtr = (char *)pbVar5;
          ParseLV4MeshLong(this,&local_48);
          goto LAB_00402a11;
        }
      }
      iVar4 = strncmp("MESH_VERTEX_LIST",(char *)pbVar5,0x10);
      if (iVar4 == 0) {
        bVar1 = pbVar6[0x11];
        if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
          pbVar5 = pbVar6 + 0x12;
          if (bVar1 == 0) {
            pbVar5 = pbVar6 + 0x11;
          }
          this->filePtr = (char *)pbVar5;
          ParseLV3MeshVertexListBlock(this,local_34,mesh);
          goto LAB_00402a11;
        }
      }
      iVar4 = strncmp("MESH_FACE_LIST",(char *)pbVar5,0xe);
      if (iVar4 == 0) {
        bVar1 = pbVar6[0xf];
        if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
          pbVar5 = pbVar6 + 0x10;
          if (bVar1 == 0) {
            pbVar5 = pbVar6 + 0xf;
          }
          this->filePtr = (char *)pbVar5;
          ParseLV3MeshFaceListBlock(this,local_38,mesh);
          goto LAB_00402a11;
        }
      }
      iVar4 = strncmp("MESH_TVERTLIST",(char *)pbVar5,0xe);
      if (iVar4 == 0) {
        bVar1 = pbVar6[0xf];
        if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
          pbVar5 = pbVar6 + 0x10;
          if (bVar1 == 0) {
            pbVar5 = pbVar6 + 0xf;
          }
          this->filePtr = (char *)pbVar5;
          ParseLV3MeshTListBlock(this,local_3c,mesh,0);
          goto LAB_00402a11;
        }
      }
      iVar4 = strncmp("MESH_TFACELIST",(char *)pbVar5,0xe);
      if (iVar4 == 0) {
        bVar1 = pbVar6[0xf];
        if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
          pbVar5 = pbVar6 + 0x10;
          if (bVar1 == 0) {
            pbVar5 = pbVar6 + 0xf;
          }
          this->filePtr = (char *)pbVar5;
          ParseLV3MeshTFaceListBlock(this,local_40,mesh,0);
          goto LAB_00402a11;
        }
      }
      iVar4 = strncmp("MESH_CVERTLIST",(char *)pbVar5,0xe);
      if (iVar4 == 0) {
        bVar1 = pbVar6[0xf];
        if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
          pbVar5 = pbVar6 + 0x10;
          if (bVar1 == 0) {
            pbVar5 = pbVar6 + 0xf;
          }
          this->filePtr = (char *)pbVar5;
          ParseLV3MeshCListBlock(this,local_44,mesh);
          goto LAB_00402a11;
        }
      }
      iVar4 = strncmp("MESH_CFACELIST",(char *)pbVar5,0xe);
      if (iVar4 == 0) {
        bVar1 = pbVar6[0xf];
        if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
          pbVar5 = pbVar6 + 0x10;
          if (bVar1 == 0) {
            pbVar5 = pbVar6 + 0xf;
          }
          this->filePtr = (char *)pbVar5;
          ParseLV3MeshCFaceListBlock(this,local_48,mesh);
          goto LAB_00402a11;
        }
      }
      iVar4 = strncmp("MESH_NORMALS",(char *)pbVar5,0xc);
      if (iVar4 == 0) {
        bVar1 = pbVar6[0xd];
        if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
          pbVar5 = pbVar6 + 0xe;
          if (bVar1 == 0) {
            pbVar5 = pbVar6 + 0xd;
          }
          this->filePtr = (char *)pbVar5;
          ParseLV3MeshNormalListBlock(this,mesh);
          goto LAB_00402a11;
        }
      }
      bVar3 = TokenMatch<char_const>(&this->filePtr,"MESH_MAPPINGCHANNEL",0x13);
      if (!bVar3) {
LAB_00402bea:
        bVar3 = TokenMatch<char_const>(&this->filePtr,"MESH_ANIMATION",0xe);
        if (bVar3) {
          LogWarning(this,
                     "Found *MESH_ANIMATION element in ASE/ASK file. Keyframe animation is not supported by Assimp, this element will be ignored"
                    );
        }
        else {
          bVar3 = TokenMatch<char_const>(&this->filePtr,"MESH_WEIGHTS",0xc);
          if (!bVar3) {
            pbVar6 = (byte *)this->filePtr;
            bVar1 = *pbVar6;
            goto LAB_00402f73;
          }
          ParseLV3MeshWeightsBlock(this,mesh);
        }
        goto LAB_00402a11;
      }
      local_4c = 0;
      ParseLV4MeshLong(this,&local_4c);
      uVar2 = local_4c;
      if (local_4c == 1) {
        LogWarning(this,"Mapping channel has an invalid index. Skipping UV channel");
        SkipSection(this);
      }
      else {
        if (local_4c == 0) {
          LogWarning(this,"Mapping channel has an invalid index. Skipping UV channel");
          SkipSection(this);
          goto LAB_00402bea;
        }
        if (8 < local_4c) {
          LogWarning(this,"Too many UV channels specified. Skipping channel ..");
          SkipSection(this);
          goto LAB_00402a11;
        }
      }
      ParseLV3MappingChannel(this,uVar2 - 1,mesh);
      goto LAB_00402a11;
    }
    bVar1 = pbVar6[0xf];
    if ((0x20 < (ulong)bVar1) || ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) == 0))
    goto LAB_00402a3e;
    pbVar5 = pbVar6 + 0x10;
    if (bVar1 == 0) {
      pbVar5 = pbVar6 + 0xf;
    }
    this->filePtr = (char *)pbVar5;
    ParseLV4MeshLong(this,&local_34);
  } while( true );
}

Assistant:

void Parser::ParseLV2MeshBlock(ASE::Mesh& mesh)
{
    AI_ASE_PARSER_INIT();

    unsigned int iNumVertices = 0;
    unsigned int iNumFaces = 0;
    unsigned int iNumTVertices = 0;
    unsigned int iNumTFaces = 0;
    unsigned int iNumCVertices = 0;
    unsigned int iNumCFaces = 0;
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;
            // Number of vertices in the mesh
            if (TokenMatch(filePtr,"MESH_NUMVERTEX" ,14))
            {
                ParseLV4MeshLong(iNumVertices);
                continue;
            }
            // Number of texture coordinates in the mesh
            if (TokenMatch(filePtr,"MESH_NUMTVERTEX" ,15))
            {
                ParseLV4MeshLong(iNumTVertices);
                continue;
            }
            // Number of vertex colors in the mesh
            if (TokenMatch(filePtr,"MESH_NUMCVERTEX" ,15))
            {
                ParseLV4MeshLong(iNumCVertices);
                continue;
            }
            // Number of regular faces in the mesh
            if (TokenMatch(filePtr,"MESH_NUMFACES" ,13))
            {
                ParseLV4MeshLong(iNumFaces);
                continue;
            }
            // Number of UVWed faces in the mesh
            if (TokenMatch(filePtr,"MESH_NUMTVFACES" ,15))
            {
                ParseLV4MeshLong(iNumTFaces);
                continue;
            }
            // Number of colored faces in the mesh
            if (TokenMatch(filePtr,"MESH_NUMCVFACES" ,15))
            {
                ParseLV4MeshLong(iNumCFaces);
                continue;
            }
            // mesh vertex list block
            if (TokenMatch(filePtr,"MESH_VERTEX_LIST" ,16))
            {
                ParseLV3MeshVertexListBlock(iNumVertices,mesh);
                continue;
            }
            // mesh face list block
            if (TokenMatch(filePtr,"MESH_FACE_LIST" ,14))
            {
                ParseLV3MeshFaceListBlock(iNumFaces,mesh);
                continue;
            }
            // mesh texture vertex list block
            if (TokenMatch(filePtr,"MESH_TVERTLIST" ,14))
            {
                ParseLV3MeshTListBlock(iNumTVertices,mesh);
                continue;
            }
            // mesh texture face block
            if (TokenMatch(filePtr,"MESH_TFACELIST" ,14))
            {
                ParseLV3MeshTFaceListBlock(iNumTFaces,mesh);
                continue;
            }
            // mesh color vertex list block
            if (TokenMatch(filePtr,"MESH_CVERTLIST" ,14))
            {
                ParseLV3MeshCListBlock(iNumCVertices,mesh);
                continue;
            }
            // mesh color face block
            if (TokenMatch(filePtr,"MESH_CFACELIST" ,14))
            {
                ParseLV3MeshCFaceListBlock(iNumCFaces,mesh);
                continue;
            }
            // mesh normals
            if (TokenMatch(filePtr,"MESH_NORMALS" ,12))
            {
                ParseLV3MeshNormalListBlock(mesh);
                continue;
            }
            // another mesh UV channel ...
            if (TokenMatch(filePtr,"MESH_MAPPINGCHANNEL" ,19)) {
                unsigned int iIndex( 0 );
                ParseLV4MeshLong(iIndex);
                if ( 0 == iIndex ) {
                    LogWarning( "Mapping channel has an invalid index. Skipping UV channel" );
                    // skip it ...
                    SkipSection();
                } else {
                    if ( iIndex < 2 ) {
                        LogWarning( "Mapping channel has an invalid index. Skipping UV channel" );
                        // skip it ...
                        SkipSection();
                    }
                    if ( iIndex > AI_MAX_NUMBER_OF_TEXTURECOORDS ) {
                        LogWarning( "Too many UV channels specified. Skipping channel .." );
                        // skip it ...
                        SkipSection();
                    } else {
                        // parse the mapping channel
                        ParseLV3MappingChannel( iIndex - 1, mesh );
                    }
                    continue;
                }
            }
            // mesh animation keyframe. Not supported
            if (TokenMatch(filePtr,"MESH_ANIMATION" ,14))
            {

                LogWarning("Found *MESH_ANIMATION element in ASE/ASK file. "
                    "Keyframe animation is not supported by Assimp, this element "
                    "will be ignored");
                //SkipSection();
                continue;
            }
            if (TokenMatch(filePtr,"MESH_WEIGHTS" ,12))
            {
                ParseLV3MeshWeightsBlock(mesh);continue;
            }
        }
        AI_ASE_HANDLE_SECTION("2","*MESH");
    }
    return;
}